

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_long>
          (RecyclableObject *pObj,unsigned_long len,unsigned_long start,unsigned_long deleteLen,
          Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  JavascriptArray *object;
  bool bVar1;
  uint uVar2;
  BOOL BVar3;
  JavascriptArray *pJVar4;
  JavascriptCopyOnAccessNativeIntArray *this;
  Var pvVar5;
  ulong uVar6;
  ulong uVar7;
  ScriptContext *scriptContext_00;
  uint64 uVar8;
  unsigned_long uVar9;
  BigIndex idxDest;
  BigIndex index;
  BigIndex local_a8;
  Var *local_98;
  JavascriptArray *local_90;
  JavascriptArray *local_88;
  uint32 local_7c;
  undefined1 local_78 [8];
  BigIndex k;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  
  local_50 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  local_98 = insertArgs;
  local_7c = insertLen;
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pObj);
  if (pNewObj == (RecyclableObject *)0x0) {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    insertArgs = (Var *)0x0;
    pNewObj = ArraySpeciesCreate<unsigned_long>
                        (pObj,deleteLen,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    *(bool *)((long)local_50 + 0x108) = true;
    if ((JavascriptArray *)pNewObj == (JavascriptArray *)0x0) {
      if (deleteLen >> 0x20 != 0) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5b,(PCWSTR)0x0);
      }
      pNewObj = (RecyclableObject *)
                JavascriptLibrary::CreateArray
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                           (uint32)deleteLen);
      if ((((JavascriptArray *)pNewObj)->head).ptr == EmptySegment) {
        AllocateHead<void*>((JavascriptArray *)pNewObj);
      }
    }
  }
  bVar1 = IsNonES5Array(pNewObj);
  if (bVar1) {
    pJVar4 = UnsafeVarTo<Js::JavascriptArray>(pNewObj);
  }
  else {
    pJVar4 = (JavascriptArray *)0x0;
  }
  local_90 = pJVar4;
  local_88 = (JavascriptArray *)pNewObj;
  k.bigIndex = start;
  if (pJVar4 == (JavascriptArray *)0x0) {
    BigIndex::BigIndex((BigIndex *)local_78,0);
    if (deleteLen != 0) {
      uVar8 = k.bigIndex;
      uVar9 = deleteLen;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar3 = JavascriptOperators::HasItem(pObj,uVar8);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        if (BVar3 != 0) {
          *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar8,scriptContext);
          idxDest.bigIndex = (uint64)pvVar5;
          idxDest.index = k.index;
          idxDest._4_4_ = k._4_4_;
          uVar2 = SetArrayLikeObjects(local_88,(RecyclableObject *)(ulong)(uint)local_78._0_4_,
                                      idxDest,insertArgs);
          index.bigIndex = (uint64)insertArgs;
          index.index = k.index;
          index._4_4_ = k._4_4_;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar2,(BOOL)scriptContext,
                              (ScriptContext *)(ulong)(uint)local_78._0_4_,index);
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
          *(bool *)((long)local_50 + 0x108) = true;
        }
        if (local_78._0_4_ == 0xffffffff) {
          k._0_8_ = k._0_8_ + 1;
        }
        else {
          local_78._0_4_ = local_78._0_4_ + 1;
        }
        uVar8 = uVar8 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else {
    bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar4);
    if (bVar1) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar4);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_50,pJVar4);
    if (deleteLen != 0) {
      uVar6 = 0;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar8 = uVar6 + k.bigIndex;
        BVar3 = JavascriptOperators::HasItem(pObj,uVar8);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        if (BVar3 != 0) {
          *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar8,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
          *(bool *)((long)local_50 + 0x108) = true;
          (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_90,uVar6,pvVar5,0);
        }
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (uVar6 < deleteLen);
    }
  }
  uVar8 = k.bigIndex;
  uVar6 = (ulong)local_7c;
  if (deleteLen < uVar6) {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BigIndex::BigIndex((BigIndex *)local_78,uVar6 + k.bigIndex);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_long>
              (pObj,(BigIndex *)local_78,deleteLen + uVar8,len,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    *(bool *)((long)local_50 + 0x108) = true;
  }
  else if (uVar6 < deleteLen) {
    uVar7 = deleteLen + k.bigIndex;
    if (uVar7 < len) {
      uVar8 = k.bigIndex + uVar6;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar3 = JavascriptOperators::HasItem(pObj,uVar7);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (BVar3 == 0) {
          BVar3 = JavascriptOperators::DeleteItem
                            (pObj,uVar8,PropertyOperation_ThrowOnDeleteIfNotConfig);
          if (BVar3 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        }
        else {
          pvVar5 = JavascriptOperators::GetItem(pObj,uVar7,scriptContext);
          BVar3 = JavascriptOperators::SetItem
                            (pObj,pObj,uVar8,pvVar5,scriptContext,
                             PropertyOperation_ThrowIfNotExtensible);
          if (BVar3 == 0) {
            JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
          }
          JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        }
        *(bool *)((long)local_50 + 0x108) = true;
        uVar7 = uVar7 + 1;
        uVar8 = uVar8 + 1;
      } while (uVar7 < len);
    }
    uVar7 = (len - deleteLen) + uVar6;
    if (uVar7 < len) {
      uVar9 = len;
      do {
        *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        uVar9 = uVar9 - 1;
        BVar3 = JavascriptOperators::DeleteItem
                          (pObj,uVar9,PropertyOperation_ThrowOnDeleteIfNotConfig);
        if (BVar3 == 0) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        *(bool *)((long)local_50 + 0x108) = true;
      } while (uVar7 < uVar9);
    }
  }
  if (local_7c != 0) {
    uVar7 = 0;
    do {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BigIndex::BigIndex((BigIndex *)local_78,k.bigIndex + uVar7);
      BVar3 = BigIndex::SetItem((BigIndex *)local_78,pObj,local_98[uVar7],
                                PropertyOperation_ThrowIfNotExtensible);
      if (BVar3 == 0) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  scriptContext_00 = (ScriptContext *)((len - deleteLen) + uVar6);
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BigIndex::BigIndex((BigIndex *)local_78,(uint64)scriptContext_00);
  pvVar5 = BigIndex::ToNumber((BigIndex *)local_78,scriptContext_00);
  BVar3 = JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar5,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  object = local_88;
  pJVar4 = local_90;
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  BigIndex::BigIndex(&local_a8,deleteLen);
  pvVar5 = BigIndex::ToNumber(&local_a8,(ScriptContext *)deleteLen);
  BVar3 = JavascriptOperators::SetProperty
                    (object,(RecyclableObject *)object,0xd1,pvVar5,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.splice");
  }
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  *(bool *)((long)local_50 + 0x108) = true;
  if (pJVar4 != (JavascriptArray *)0x0) {
    (*(pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar4);
  }
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return (RecyclableObject *)object;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }